

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_add_entry
                  (archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id,char *name)

{
  wchar_t wVar1;
  archive_acl_entry *paVar2;
  wchar_t wVar3;
  
  wVar1 = acl_special(acl,type,permset,tag);
  wVar3 = L'\0';
  if (wVar1 != L'\0') {
    paVar2 = acl_new_entry(acl,type,permset,tag,id);
    if (paVar2 == (archive_acl_entry *)0x0) {
      wVar3 = L'\xffffffe7';
    }
    else {
      wVar3 = L'\0';
      if ((name == (char *)0x0) || (*name == '\0')) {
        archive_mstring_clean(&paVar2->name);
      }
      else {
        archive_mstring_copy_mbs(&paVar2->name,name);
      }
    }
  }
  return wVar3;
}

Assistant:

int
archive_acl_add_entry(struct archive_acl *acl,
    int type, int permset, int tag, int id, const char *name)
{
	struct archive_acl_entry *ap;

	if (acl_special(acl, type, permset, tag) == 0)
		return ARCHIVE_OK;
	ap = acl_new_entry(acl, type, permset, tag, id);
	if (ap == NULL) {
		/* XXX Error XXX */
		return ARCHIVE_FAILED;
	}
	if (name != NULL  &&  *name != '\0')
		archive_mstring_copy_mbs(&ap->name, name);
	else
		archive_mstring_clean(&ap->name);
	return ARCHIVE_OK;
}